

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O2

int32_t __thiscall
webrtc::TraceImpl::AddMessage(TraceImpl *this,char *trace_message,char *msg,uint16_t written_so_far)

{
  int iVar1;
  size_t __maxlen;
  
  if (0x3ff < written_so_far) {
    return -1;
  }
  __maxlen = (ulong)(0x400 - written_so_far & 0xffff) - 2;
  iVar1 = snprintf(trace_message,__maxlen,"%s",msg);
  if (iVar1 < 0 || (int)__maxlen < iVar1) {
    trace_message[__maxlen] = '\0';
    iVar1 = (int)__maxlen;
  }
  return iVar1 + 1;
}

Assistant:

int32_t TraceImpl::AddMessage(
    char* trace_message,
    const char msg[WEBRTC_TRACE_MAX_MESSAGE_SIZE],
    const uint16_t written_so_far) const {
  int length = 0;
  if (written_so_far >= WEBRTC_TRACE_MAX_MESSAGE_SIZE) {
    return -1;
  }
  // - 2 to leave room for newline and NULL termination.
#ifdef _WIN32
  length = _snprintf(trace_message,
                     WEBRTC_TRACE_MAX_MESSAGE_SIZE - written_so_far - 2,
                     "%s", msg);
  if (length < 0) {
    length = WEBRTC_TRACE_MAX_MESSAGE_SIZE - written_so_far - 2;
    trace_message[length] = 0;
  }
#else
  length = snprintf(trace_message,
                    WEBRTC_TRACE_MAX_MESSAGE_SIZE - written_so_far - 2,
                    "%s", msg);
  if (length < 0 ||
      length > WEBRTC_TRACE_MAX_MESSAGE_SIZE - written_so_far - 2) {
    length = WEBRTC_TRACE_MAX_MESSAGE_SIZE - written_so_far - 2;
    trace_message[length] = 0;
  }
#endif
  // Length with NULL termination.
  return length + 1;
}